

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O2

String * __thiscall
Diligent::GetShaderStagesString_abi_cxx11_
          (String *__return_storage_ptr__,Diligent *this,SHADER_TYPE ShaderStages)

{
  char (*in_RCX) [18];
  SHADER_TYPE SVar1;
  ulong uVar2;
  Uint32 Stage;
  SHADER_TYPE ShaderType;
  string msg;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  uVar2 = (ulong)this & 0xffffffff;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  for (ShaderType = SHADER_TYPE_VERTEX;
      (SVar1 = (SHADER_TYPE)uVar2, SVar1 != SHADER_TYPE_UNKNOWN &&
      (ShaderType < (SHADER_TYPE_LAST|SHADER_TYPE_VERTEX))); ShaderType = ShaderType * 2) {
    if ((ShaderType & SVar1) != SHADER_TYPE_UNKNOWN) {
      if (__return_storage_ptr__->_M_string_length != 0) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      GetShaderTypeLiteralName(ShaderType);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      uVar2 = (ulong)(SVar1 & ~ShaderType);
    }
  }
  if (SVar1 != SHADER_TYPE_UNKNOWN) {
    FormatString<char[26],char[18]>
              (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])"ShaderStages == 0",
               in_RCX);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GetShaderStagesString",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x336);
    std::__cxx11::string::~string((string *)&msg);
  }
  return __return_storage_ptr__;
}

Assistant:

String GetShaderStagesString(SHADER_TYPE ShaderStages)
{
    String StagesStr;
    for (Uint32 Stage = SHADER_TYPE_VERTEX; ShaderStages != 0 && Stage <= SHADER_TYPE_LAST; Stage <<= 1)
    {
        if (ShaderStages & Stage)
        {
            if (StagesStr.length())
                StagesStr += ", ";
            StagesStr += GetShaderTypeLiteralName(static_cast<SHADER_TYPE>(Stage));
            ShaderStages &= ~static_cast<SHADER_TYPE>(Stage);
        }
    }
    VERIFY_EXPR(ShaderStages == 0);
    return StagesStr;
}